

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::CoverageOptionSetter>::
emplace_back<slang::ast::Scope_const&,slang::syntax::CoverageOptionSyntax_const&>
          (SmallVectorBase<slang::ast::CoverageOptionSetter> *this,Scope *args,
          CoverageOptionSyntax *args_1)

{
  pointer pCVar1;
  CoverageOptionSyntax *in_RDI;
  CoverageOptionSetter *unaff_retaddr;
  CoverageOptionSyntax *in_stack_00000028;
  Scope *in_stack_00000030;
  pointer in_stack_00000038;
  SmallVectorBase<slang::ast::CoverageOptionSetter> *in_stack_00000040;
  CoverageOptionSyntax *syntax;
  Scope *in_stack_fffffffffffffff8;
  
  if ((in_RDI->super_MemberSyntax).super_SyntaxNode.parent ==
      (in_RDI->super_MemberSyntax).super_SyntaxNode.previewNode) {
    end((SmallVectorBase<slang::ast::CoverageOptionSetter> *)in_RDI);
    pCVar1 = emplaceRealloc<slang::ast::Scope_const&,slang::syntax::CoverageOptionSyntax_const&>
                       (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  }
  else {
    syntax = in_RDI;
    end((SmallVectorBase<slang::ast::CoverageOptionSetter> *)in_RDI);
    slang::ast::CoverageOptionSetter::CoverageOptionSetter
              (unaff_retaddr,in_stack_fffffffffffffff8,syntax);
    (in_RDI->super_MemberSyntax).super_SyntaxNode.parent =
         (SyntaxNode *)((long)&((in_RDI->super_MemberSyntax).super_SyntaxNode.parent)->kind + 1);
    pCVar1 = back((SmallVectorBase<slang::ast::CoverageOptionSetter> *)in_RDI);
  }
  return pCVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }